

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::collectUniqueBasicTypes
               (set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                *basicTypes,VarType *type)

{
  bool bVar1;
  StructType *pSVar2;
  pointer this;
  VarType *pVVar3;
  DataType local_2c;
  __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
  local_28;
  __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
  local_20;
  ConstIterator iter;
  VarType *type_local;
  set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *basicTypes_local;
  
  iter._M_current = (StructMember *)type;
  bVar1 = VarType::isStructType(type);
  if (bVar1) {
    pSVar2 = VarType::getStruct((VarType *)iter._M_current);
    local_20._M_current = (StructMember *)StructType::begin(pSVar2);
    while( true ) {
      pSVar2 = VarType::getStruct((VarType *)iter._M_current);
      local_28._M_current = (StructMember *)StructType::end(pSVar2);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      this = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
             ::operator->(&local_20);
      pVVar3 = StructMember::getType(this);
      collectUniqueBasicTypes(basicTypes,pVVar3);
      __gnu_cxx::
      __normal_iterator<const_deqp::gls::ub::StructMember_*,_std::vector<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>_>
      ::operator++(&local_20);
    }
  }
  else {
    bVar1 = VarType::isArrayType((VarType *)iter._M_current);
    if (bVar1) {
      pVVar3 = VarType::getElementType((VarType *)iter._M_current);
      collectUniqueBasicTypes(basicTypes,pVVar3);
    }
    else {
      local_2c = VarType::getBasicType((VarType *)iter._M_current);
      std::set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>::insert
                (basicTypes,&local_2c);
    }
  }
  return;
}

Assistant:

void collectUniqueBasicTypes (std::set<glu::DataType>& basicTypes, const VarType& type)
{
	if (type.isStructType())
	{
		for (StructType::ConstIterator iter = type.getStruct().begin(); iter != type.getStruct().end(); ++iter)
			collectUniqueBasicTypes(basicTypes, iter->getType());
	}
	else if (type.isArrayType())
		collectUniqueBasicTypes(basicTypes, type.getElementType());
	else
	{
		DE_ASSERT(type.isBasicType());
		basicTypes.insert(type.getBasicType());
	}
}